

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorProto::MergePartialFromCodedStream
          (DescriptorProto *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  string *value;
  char *data;
  DescriptorProto *value_00;
  EnumDescriptorProto *value_01;
  DescriptorProto_ExtensionRange *value_02;
  FieldDescriptorProto *pFVar5;
  MessageOptions *value_03;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  DescriptorProto *this_local;
  uint32 local_c0;
  
LAB_002f3307:
  if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
    input->last_tag_ = (uint)*input->buffer_;
    io::CodedInputStream::Advance(input,1);
    local_c0 = input->last_tag_;
  }
  else {
    uVar2 = io::CodedInputStream::ReadTagFallback(input);
    input->last_tag_ = uVar2;
    local_c0 = input->last_tag_;
  }
  if (local_c0 == 0) {
    return true;
  }
  iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_c0);
  switch(iVar3) {
  case 1:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_c0);
    if (WVar4 != WIRETYPE_LENGTH_DELIMITED) break;
    value = mutable_name_abi_cxx11_(this);
    bVar1 = internal::WireFormatLite::ReadString(input,value);
    if (!bVar1) {
      return false;
    }
    name_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(data,iVar3,PARSE);
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
      io::CodedInputStream::Advance(input,1);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
LAB_002f357f:
      do {
        pFVar5 = add_field(this);
        bVar1 = internal::WireFormatLite::
                ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>(input,pFVar5);
        if (!bVar1) {
          return false;
        }
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
          io::CodedInputStream::Advance(input,1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      } while (bVar1);
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x1a')) {
        io::CodedInputStream::Advance(input,1);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
LAB_002f37c7:
        do {
          value_00 = add_nested_type(this);
          bVar1 = internal::WireFormatLite::ReadMessageNoVirtual<google::protobuf::DescriptorProto>
                            (input,value_00);
          if (!bVar1) {
            return false;
          }
          if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x1a')) {
            io::CodedInputStream::Advance(input,1);
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        } while (bVar1);
        if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\"')) {
          io::CodedInputStream::Advance(input,1);
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
        if (bVar1) {
LAB_002f3a0f:
          do {
            value_01 = add_enum_type(this);
            bVar1 = internal::WireFormatLite::
                    ReadMessageNoVirtual<google::protobuf::EnumDescriptorProto>(input,value_01);
            if (!bVar1) {
              return false;
            }
            if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\"')) {
              io::CodedInputStream::Advance(input,1);
              bVar1 = true;
            }
            else {
              bVar1 = false;
            }
          } while (bVar1);
          if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '*')) {
            io::CodedInputStream::Advance(input,1);
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
          if (bVar1) {
LAB_002f3c57:
            do {
              value_02 = add_extension_range(this);
              bVar1 = internal::WireFormatLite::
                      ReadMessageNoVirtual<google::protobuf::DescriptorProto_ExtensionRange>
                                (input,value_02);
              if (!bVar1) {
                return false;
              }
              if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '*')) {
                io::CodedInputStream::Advance(input,1);
                bVar1 = true;
              }
              else {
                bVar1 = false;
              }
            } while (bVar1);
            if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '2')) {
              io::CodedInputStream::Advance(input,1);
              bVar1 = true;
            }
            else {
              bVar1 = false;
            }
            if (bVar1) {
LAB_002f3ee1:
              do {
                pFVar5 = add_extension(this);
                bVar1 = internal::WireFormatLite::
                        ReadMessageNoVirtual<google::protobuf::FieldDescriptorProto>(input,pFVar5);
                if (!bVar1) {
                  return false;
                }
                if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '2')) {
                  io::CodedInputStream::Advance(input,1);
                  bVar1 = true;
                }
                else {
                  bVar1 = false;
                }
              } while (bVar1);
              if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == ':')) {
                io::CodedInputStream::Advance(input,1);
                bVar1 = true;
              }
              else {
                bVar1 = false;
              }
              if (bVar1) {
LAB_002f4183:
                value_03 = mutable_options(this);
                bVar1 = internal::WireFormatLite::
                        ReadMessageNoVirtual<google::protobuf::MessageOptions>(input,value_03);
                if (!bVar1) {
                  return false;
                }
                bVar1 = io::CodedInputStream::ExpectAtEnd(input);
                if (bVar1) {
                  return true;
                }
              }
            }
          }
        }
      }
    }
    goto LAB_002f3307;
  case 2:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_c0);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f357f;
    break;
  case 3:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_c0);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f37c7;
    break;
  case 4:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_c0);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f3a0f;
    break;
  case 5:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_c0);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f3c57;
    break;
  case 6:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_c0);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f3ee1;
    break;
  case 7:
    WVar4 = internal::WireFormatLite::GetTagWireType(local_c0);
    if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_002f4183;
  }
  WVar4 = internal::WireFormatLite::GetTagWireType(local_c0);
  if (WVar4 == WIRETYPE_END_GROUP) {
    return true;
  }
  unknown_fields = mutable_unknown_fields(this);
  bVar1 = internal::WireFormat::SkipField(input,local_c0,unknown_fields);
  if (!bVar1) {
    return false;
  }
  goto LAB_002f3307;
}

Assistant:

bool DescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_field;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_field:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_field()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_field;
        if (input->ExpectTag(26)) goto parse_nested_type;
        break;
      }

      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_nested_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_nested_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(26)) goto parse_nested_type;
        if (input->ExpectTag(34)) goto parse_enum_type;
        break;
      }

      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_enum_type:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_enum_type()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(34)) goto parse_enum_type;
        if (input->ExpectTag(42)) goto parse_extension_range;
        break;
      }

      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension_range:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension_range()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(42)) goto parse_extension_range;
        if (input->ExpectTag(50)) goto parse_extension;
        break;
      }

      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extension:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_extension()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_extension;
        if (input->ExpectTag(58)) goto parse_options;
        break;
      }

      // optional .google.protobuf.MessageOptions options = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}